

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v2_local
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *residual_local,
          TPZFMatrix<std::complex<float>_> *v2_local)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  complex<float> value;
  complex<float> in_R9;
  long rows;
  int ic;
  ulong uVar10;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  int in_stack_fffffffffffffb98;
  TPZFMatrix<std::complex<float>_> temp2;
  TPZFMatrix<std::complex<float>_> I_lambda;
  TPZFMatrix<std::complex<float>_> KWeightedResidual;
  TPZFMatrix<std::complex<float>_> zi;
  TPZFMatrix<std::complex<float>_> CstarKW;
  TPZFMatrix<std::complex<float>_> Lambda_star;
  TPZFMatrix<std::complex<float>_> LocalWeightedResidual;
  
  uVar10 = (residual_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  iVar1 = (int)uVar10;
  lVar7 = (long)iVar1;
  I_lambda.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (&LocalWeightedResidual,(long)this->fNEquations,lVar7,(complex<float> *)&I_lambda);
  uVar3 = (this->fGlobalEqs).fNElements;
  uVar9 = 0;
  iVar6 = (int)uVar3;
  uVar2 = 0;
  if (0 < iVar6) {
    uVar2 = uVar3 & 0xffffffff;
  }
  uVar3 = 0;
  if (0 < iVar1) {
    uVar3 = uVar10 & 0xffffffff;
  }
  for (; uVar9 != uVar3; uVar9 = uVar9 + 1) {
    for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
      pcVar5 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore;
      lVar8 = (long)(this->fGlobalEqs).fStore[uVar10].first;
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(residual_local,uVar10,uVar9);
      std::operator*(pcVar5 + lVar8,pcVar4);
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()(&LocalWeightedResidual,lVar8,uVar9);
      pcVar5->_M_value =
           CONCAT44(extraout_XMM0_Db + (float)(pcVar5->_M_value >> 0x20),
                    extraout_XMM0_Da + (float)pcVar5->_M_value);
    }
  }
  lVar8 = (long)this->fNEquations;
  rows = (long)((int)(this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                     fRow + (int)(this->fCoarseIndex).fNElements);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&I_lambda,rows,lVar7);
  memset(I_lambda.fElem,0,
         I_lambda.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow *
         I_lambda.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol * 8);
  I_lambda.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&KWeightedResidual,lVar8,lVar7);
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->fInvertedStiffness,&LocalWeightedResidual,&KWeightedResidual,
             (TPZFMatrix<std::complex<float>_> *)0x0);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&Lambda_star,rows,1);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&CstarKW,rows,lVar7);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (&this->fC_star,&KWeightedResidual,&KWeightedResidual,&CstarKW,(complex<float>)0x0,in_R9
             ,in_stack_fffffffffffffb98);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&temp2,rows,lVar7);
  TPZMatrix<std::complex<float>_>::Add
            (&I_lambda.super_TPZMatrix<std::complex<float>_>,
             &CstarKW.super_TPZMatrix<std::complex<float>_>,
             &temp2.super_TPZMatrix<std::complex<float>_>);
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->finv,&temp2,&Lambda_star,(TPZFMatrix<std::complex<float>_> *)0x0);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&zi,lVar8,lVar7);
  TPZFMatrix<std::complex<float>_>::Resize(&temp2,lVar8,lVar7);
  value._M_value = (_ComplexT)&Lambda_star;
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<float>_>,
             (TPZFMatrix<std::complex<float>_> *)value._M_value,&temp2,0);
  TPZFMatrix<std::complex<float>_>::operator*=(&temp2,value);
  TPZMatrix<std::complex<float>_>::Add
            (&temp2.super_TPZMatrix<std::complex<float>_>,
             &KWeightedResidual.super_TPZMatrix<std::complex<float>_>,
             &zi.super_TPZMatrix<std::complex<float>_>);
  (*(v2_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(v2_local,(long)iVar6,lVar7);
  for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      pcVar5 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore;
      lVar7 = (long)(this->fGlobalEqs).fStore[uVar9].first;
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(&zi,lVar7,uVar10);
      std::operator*(pcVar5 + lVar7,pcVar4);
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()(v2_local,uVar9,uVar10);
      pcVar5->_M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&zi);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&temp2);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&CstarKW);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&Lambda_star);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&KWeightedResidual);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&I_lambda);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&LocalWeightedResidual);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2_local(TPZFMatrix<TVar> &residual_local, TPZFMatrix<TVar> &v2_local)
{
    int ncols = residual_local.Cols();
	TPZFMatrix<TVar> LocalWeightedResidual(fNEquations,ncols,0.);
	int neqs = fGlobalEqs.NElements();
	int i;
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            LocalWeightedResidual(ind.first,ic) += fWeights[ind.first] * residual_local(i,ic);
        }
    }
	int ncoarse = fCoarseIndex.NElements();
	// size of the kernel
	int nnull = fNullPivots.Rows();
	// number of global indices
	int nglob = fNEquations;
	/** Solving the system for zi */
	//Constructing I star is the same I star for Phi
	//C star is the same C star for Phi
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+nnull,ncols);
	I_lambda.Zero();
	//K_star_inv*C_star_trans is the same used for Phi
	/* Computing K_star_inv*W(i)*R(i)*r = K_star_inv*fLocalWeightedResidual */
	TPZFMatrix<TVar> KWeightedResidual(nglob,ncols);
	fInvertedStiffness.Solve(LocalWeightedResidual,KWeightedResidual);
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+nnull,1);
	TPZFMatrix<TVar> CstarKW(ncoarse+nnull,ncols);
	fC_star.MultAdd(KWeightedResidual,KWeightedResidual,CstarKW,-1,0,0);
	TPZFMatrix<TVar> temp2(ncoarse+nnull,ncols);
	I_lambda.Add(CstarKW,temp2);
	finv.Solve(temp2, Lambda_star);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("Lambda_star ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining z(i)
	TPZFMatrix<TVar> zi(nglob,ncols);
	temp2.Resize(nglob,ncols);
	fKeC_star.Multiply(Lambda_star,temp2);
	temp2 *= -1.;
	temp2.Add(KWeightedResidual,zi);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		zi.Print("zi ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		zi(fInternalEqs[i],0) = 0.;
	}
#endif
	v2_local.Resize(neqs, ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            v2_local(i,ic) = fWeights[ind.first] * zi(ind.first,ic);
        }
    }	
	
	
}